

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

QPixmap * __thiscall
QMap<Qt::DropAction,_QPixmap>::operator[](QMap<Qt::DropAction,_QPixmap> *this,DropAction *key)

{
  _Rb_tree_header *p_Var1;
  DropAction DVar2;
  QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>
  *pQVar3;
  _Base_ptr p_Var4;
  _Rb_tree_iterator<std::pair<const_Qt::DropAction,_QPixmap>_> _Var5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_Qt::DropAction,_QPixmap>_>,_bool> pVar6;
  QPixmap QStack_68;
  pair<const_Qt::DropAction,_QPixmap> local_50;
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_30.d.ptr ==
       (QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>
           *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_*>
          )(QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>
       *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>
                        *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar3 = (this->d).d.ptr;
  p_Var4 = *(_Base_ptr *)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header;
    DVar2 = *key;
    _Var5._M_node = &p_Var1->_M_header;
    do {
      if ((int)DVar2 <= (int)p_Var4[1]._M_color) {
        _Var5._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)DVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var5._M_node != p_Var1) &&
       ((int)_Var5._M_node[1]._M_color <= (int)DVar2)) goto LAB_00593898;
  }
  QPixmap::QPixmap(&QStack_68);
  local_50.first = *key;
  QPaintDevice::QPaintDevice(&local_50.second.super_QPaintDevice);
  local_50.second.data.d.ptr = QStack_68.data.d.ptr;
  local_50.second.super_QPaintDevice._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_007d25a8;
  QStack_68.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
  pVar6 = std::
          _Rb_tree<Qt::DropAction,std::pair<Qt::DropAction_const,QPixmap>,std::_Select1st<std::pair<Qt::DropAction_const,QPixmap>>,std::less<Qt::DropAction>,std::allocator<std::pair<Qt::DropAction_const,QPixmap>>>
          ::_M_insert_unique<std::pair<Qt::DropAction_const,QPixmap>>
                    ((_Rb_tree<Qt::DropAction,std::pair<Qt::DropAction_const,QPixmap>,std::_Select1st<std::pair<Qt::DropAction_const,QPixmap>>,std::less<Qt::DropAction>,std::allocator<std::pair<Qt::DropAction_const,QPixmap>>>
                      *)&pQVar3->m,&local_50);
  _Var5 = pVar6.first._M_node;
  QPixmap::~QPixmap(&local_50.second);
  QPixmap::~QPixmap(&QStack_68);
LAB_00593898:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::DropAction,_QPixmap,_std::less<Qt::DropAction>,_std::allocator<std::pair<const_Qt::DropAction,_QPixmap>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QPixmap *)&_Var5._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }